

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestStringToDoubleCommentExamples(void)

{
  char *value_source;
  char *buffer;
  StringToDoubleConverter *this;
  double dVar1;
  char *file;
  char separator;
  StringToDoubleConverter converter;
  bool all_used;
  int processed;
  int flags;
  uc16 in_stack_0000019e;
  bool *in_stack_000001a0;
  int *in_stack_000001a8;
  double in_stack_000001b0;
  int in_stack_000001bc;
  char *in_stack_000001c0;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int iVar2;
  char *in_stack_ffffffffffffff60;
  StringToDoubleConverter local_40;
  uint local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_4 = 1;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
              in_stack_ffffffffffffff40,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  value_source = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  local_4 = local_4 | 4;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  local_4 = 2;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),value_source
              ,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff48,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),value_source
              ,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  buffer = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    (int)((ulong)buffer >> 0x20),value_source,in_stack_ffffffffffffff3c);
  local_4 = local_4 | 4;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    (int)((ulong)buffer >> 0x20),value_source,in_stack_ffffffffffffff3c);
  local_4 = 0x20;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  local_4 = 0x20;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  local_4 = 5;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,
                    (int)((ulong)buffer >> 0x20),value_source,in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,in_stack_ffffffffffffff50,(double)buffer,
                    value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper(in_stack_ffffffffffffff50,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  this = (StringToDoubleConverter *)double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),
                    value_source,in_stack_ffffffffffffff3c);
  dVar1 = double_conversion::Double::NaN();
  iVar2 = (int)((ulong)dVar1 >> 0x20);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(in_stack_ffffffffffffff60,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),
                    value_source,in_stack_ffffffffffffff3c);
  file = (char *)double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            (&local_40,local_4,0.0,1.0,"infinity","NaN",0);
  double_conversion::Double::NaN();
  double_conversion::StringToDoubleConverter::StringToDouble
            (this,buffer,(int)((ulong)value_source >> 0x20),
             (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  double_conversion::Double::Infinity();
  double_conversion::StringToDoubleConverter::StringToDouble
            (this,buffer,(int)((ulong)value_source >> 0x20),
             (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  double_conversion::StringToDoubleConverter::StringToDouble
            (this,buffer,(int)((ulong)value_source >> 0x20),
             (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  local_4 = 10;
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  local_4 = 0;
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckHelper((char *)this,(int)((ulong)buffer >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToD(in_stack_000001c0,in_stack_000001bc,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
         in_stack_0000019e);
  CheckEqualsHelper(file,iVar2,(char *)this,(double)buffer,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  CheckEqualsHelper(file,iVar2,(char *)this,(int)((ulong)buffer >> 0x20),value_source,
                    in_stack_ffffffffffffff3c);
  return;
}

Assistant:

TEST(StringToDoubleCommentExamples) {
  // Make sure the examples in the comments are correct.
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_HEX;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(4660.0,
           StrToD("0x1234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(6, processed);

  flags = StringToDoubleConverter::ALLOW_OCTALS;
  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(12349.0, StrToD("012349", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  flags |= StringToDoubleConverter::ALLOW_TRAILING_JUNK;
  CHECK_EQ(668.0,
           StrToD("01234.56", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 5);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(-123.2, StrToD("-   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags  = StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN;
  CHECK_EQ(123.2, StrToD("+   123.2", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  flags = StringToDoubleConverter::ALLOW_HEX |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(4660.0, StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(4660.0, StrToD("0x1234K", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 6);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(-123.45, StrToD("-123.45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("--123.45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 0);

  CHECK_EQ(123e45, StrToD("123e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123E45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e45, StrToD("123e+45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123e-45, StrToD("123e-45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(123.0, StrToD("123e", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  CHECK_EQ(123.0, StrToD("123e-", flags, 0.0, &processed, &all_used));
  CHECK_EQ(processed, 3);

  {
    StringToDoubleConverter converter(flags, 0.0, 1.0, "infinity", "NaN");
    CHECK_EQ(Double::NaN(), converter.StringToDouble("+NaN", 4, &processed));
    CHECK_EQ(4, processed);

    CHECK_EQ(-Double::Infinity(),
             converter.StringToDouble("-infinity", 9, &processed));
    CHECK_EQ(9, processed);

    CHECK_EQ(1.0, converter.StringToDouble("Infinity", 9, &processed));
    CHECK_EQ(0, processed);
  }

  flags = StringToDoubleConverter::ALLOW_OCTALS |
      StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(Double::NaN(), StrToD("0x1234", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(668.0, StrToD("01234", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD("", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0, StrToD(" ", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0, StrToD(" 1", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToD("0x", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("0123e45", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(1239e45, StrToD("01239e45", flags, 0.0, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("-infinity", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToD("NaN", flags, 0.0, &processed, &all_used));
  CHECK_EQ(0, processed);

  flags = StringToDoubleConverter::NO_FLAGS;
  char separator = ' ';
  CHECK_EQ(1234.0,
           StrToD("1 2 3 4", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1  2", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);

  CHECK_EQ(1000000.0,
           StrToD("1 000 000.0", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(1.0,
           StrToD("1.000 000", flags, 0.0, &processed, &all_used, separator));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(),
           StrToD("1.0e1 000", flags, 0.0, &processed, &all_used, separator));
  CHECK_EQ(0, processed);
}